

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::SListLeaf::SListLeaf
          (SListLeaf *this,TermList ts)

{
  (this->super_Leaf).super_Node._term._content = ts._content;
  (this->super_Leaf).super_Node._vptr_Node = (_func_int **)&PTR__SListLeaf_009f1eb0;
  Lib::
  SkipList<Inferences::ALASCA::SuperpositionConf::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::LDComparator>
  ::SkipList(&this->_children);
  return;
}

Assistant:

SListLeaf(TermList ts) : Leaf(ts) {}